

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unsupp.cpp
# Opt level: O2

bool ReadUnsupported(MemFile *file,shared_ptr<Disk> *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char extraout_AL;
  bool bVar2;
  exception *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string strType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  array<char,_512UL> buf;
  
  MemFile::rewind(file,(FILE *)param_2);
  if (extraout_AL == '\0') {
    return false;
  }
  bVar2 = MemFile::read<std::array<char,512ul>>(file,&buf);
  if (!bVar2) {
    return false;
  }
  strType._M_dataplus._M_p = (pointer)&strType.field_2;
  strType._M_string_length = 0;
  strType.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_278.field_2;
  local_278.field_2._M_allocated_capacity = CONCAT44(buf._M_elems._4_4_,buf._M_elems._0_4_);
  local_278.field_2._M_local_buf[8] = buf._M_elems[8];
  local_278.field_2._M_local_buf[9] = buf._M_elems[9];
  local_278.field_2._M_local_buf[10] = buf._M_elems[10];
  local_278.field_2._M_local_buf[0xb] = buf._M_elems[0xb];
  local_278._M_string_length = 0xc;
  local_278.field_2._M_local_buf[0xc] = '\0';
  local_278._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = std::operator==(&local_278,"CPC-Emulator");
  if (bVar2) {
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    local_238.field_2._M_local_buf[0] = buf._M_elems[0x10];
    local_238.field_2._M_local_buf[1] = buf._M_elems[0x11];
    local_238.field_2._M_local_buf[2] = buf._M_elems[0x12];
    local_238.field_2._M_local_buf[3] = buf._M_elems[0x13];
    local_238.field_2._M_local_buf[4] = buf._M_elems[0x14];
    local_238.field_2._M_local_buf[5] = buf._M_elems[0x15];
    local_238.field_2._M_local_buf[6] = buf._M_elems[0x16];
    local_238.field_2._M_local_buf[7] = buf._M_elems[0x17];
    local_238.field_2._M_local_buf[8] = buf._M_elems[0x18];
    local_238.field_2._M_local_buf[9] = buf._M_elems[0x19];
    local_238._M_string_length = 10;
    local_238.field_2._M_local_buf[10] = '\0';
    bVar2 = std::operator==(&local_238,"DiskImageV");
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_278);
    if (!bVar2) goto LAB_001a2433;
  }
  else {
    std::__cxx11::string::~string((string *)&local_278);
LAB_001a2433:
    local_278._M_string_length = 4;
    local_278.field_2._M_local_buf[4] = 0;
    local_278.field_2._M_local_buf[0] = buf._M_elems[0];
    local_278.field_2._M_local_buf[1] = buf._M_elems[1];
    local_278.field_2._M_local_buf[2] = buf._M_elems[2];
    local_278.field_2._M_local_buf[3] = buf._M_elems[3];
    local_278._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = std::operator==(&local_278,"CPCD");
    std::__cxx11::string::~string((string *)&local_278);
    if (!bVar2) {
      local_278.field_2._M_allocated_capacity = CONCAT44(buf._M_elems._4_4_,buf._M_elems._0_4_);
      local_278._M_string_length = 8;
      local_278.field_2._8_4_ = local_278.field_2._8_4_ & 0xffffff00;
      local_278._M_dataplus._M_p = (pointer)paVar1;
      bVar2 = std::operator==(&local_278,"NORMDISK");
      std::__cxx11::string::~string((string *)&local_278);
      if (!bVar2) goto LAB_001a24bd;
    }
  }
  std::__cxx11::string::assign((char *)&strType);
LAB_001a24bd:
  if (strType._M_string_length == 0) {
    std::__cxx11::string::~string((string *)&strType);
    return false;
  }
  this = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<std::__cxx11::string&,char_const(&)[41]>
            (this,&strType,(char (*) [41])" disk images are not currently supported");
  __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadUnsupported(MemFile& file, std::shared_ptr<Disk>&/*disk*/)
{
    std::array<char, SECTOR_SIZE> buf;
    if (!file.rewind() || !file.read(buf))
        return false;

    std::string strType;

    if (std::string(buf.data() + 0x00, 12) == "CPC-Emulator" && std::string(buf.data() + 0x10, 10) == "DiskImageV")
        strType = "CPCemu";
    else if (std::string(buf.data() + 0x00, 4) == "CPCD")
        strType = "EmuCPC";
    else if (std::string(buf.data() + 0x00, 8) == "NORMDISK")
        strType = "CPD";

    if (!strType.empty())
        throw util::exception(strType, " disk images are not currently supported");

    return false;
}